

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cpp
# Opt level: O0

string * __thiscall Kernel::Signature::functionName_abi_cxx11_(Signature *this,int number)

{
  bool bVar1;
  int iVar2;
  Symbol **ppSVar3;
  string *psVar4;
  uint in_ESI;
  Signature *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  Options *in_stack_ffffffffffffffc0;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  uint local_14;
  Signature *__a;
  char *in_stack_fffffffffffffff8;
  
  local_14 = in_ESI;
  __a = in_RDI;
  bVar1 = Shell::Options::showFOOL(in_stack_ffffffffffffffc0);
  if ((bVar1) || (bVar1 = isFoolConstantSymbol(in_RDI,false,local_14), !bVar1)) {
    bVar1 = Shell::Options::showFOOL(in_stack_ffffffffffffffc0);
    if ((bVar1) || (bVar1 = isFoolConstantSymbol(in_RDI,true,local_14), !bVar1)) {
      ppSVar3 = Lib::Stack<Kernel::Signature::Symbol_*>::operator[]
                          (&in_RDI->_funs,(long)(int)local_14);
      psVar4 = Symbol::name_abi_cxx11_(*ppSVar3);
    }
    else {
      if ((functionName[abi:cxx11](int)::troo_abi_cxx11_ == '\0') &&
         (iVar2 = __cxa_guard_acquire(&functionName[abi:cxx11](int)::troo_abi_cxx11_), iVar2 != 0))
      {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (unaff_retaddr,in_stack_fffffffffffffff8,(allocator<char> *)__a);
        std::allocator<char>::~allocator(local_25);
        __cxa_atexit(std::__cxx11::string::~string,&functionName[abi:cxx11](int)::troo_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&functionName[abi:cxx11](int)::troo_abi_cxx11_);
      }
      psVar4 = &functionName[abi:cxx11](int)::troo_abi_cxx11_;
    }
  }
  else {
    if ((functionName[abi:cxx11](int)::fols_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&functionName[abi:cxx11](int)::fols_abi_cxx11_), iVar2 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (unaff_retaddr,in_stack_fffffffffffffff8,(allocator<char> *)__a);
      std::allocator<char>::~allocator(&local_15);
      __cxa_atexit(std::__cxx11::string::~string,&functionName[abi:cxx11](int)::fols_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&functionName[abi:cxx11](int)::fols_abi_cxx11_);
    }
    psVar4 = &functionName[abi:cxx11](int)::fols_abi_cxx11_;
  }
  return psVar4;
}

Assistant:

const std::string& Signature::functionName(int number)
{
  // it is safe to reuse "$true" and "$false" for constants
  // because the user cannot define constants with these names herself
  // and the formula, obtained by toString() with "$true" or "$false"
  // in term position would be syntactically valid in FOOL
  if (!env.options->showFOOL() && isFoolConstantSymbol(false,number)) {
    static std::string fols("$false");
    return fols;
  }
  if (!env.options->showFOOL() && isFoolConstantSymbol(true,number)) { 
    static std::string troo("$true");
    return troo;
  }
  return _funs[number]->name();
}